

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6462d::IntrusiveListIteratorTest::~IntrusiveListIteratorTest
          (IntrusiveListIteratorTest *this)

{
  (this->super_IntrusiveListTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IntrusiveListIteratorTest_002e99b8;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&this->list_);
  testing::Test::~Test((Test *)this);
  return;
}

Assistant:

virtual void SetUp() {
    IntrusiveListTest::SetUp();

    list_.emplace_back(1);
    list_.emplace_back(2);
    list_.emplace_back(3);
  }